

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall KokkosTools::SpaceTimeStack::State::~State(State *this)

{
  ostream *poVar1;
  char *pcVar2;
  Allocations *local_348;
  State *local_330;
  int local_2e4;
  undefined1 local_2e0 [4];
  int space;
  StackNode inv_stack_root;
  ostream local_240 [8];
  ofstream fout;
  string local_40;
  Impl local_20;
  Now end_time;
  bool mpi_usable;
  State *this_local;
  
  end_time.impl.__d.__r._7_1_ = 0;
  local_20.__d.__r = (duration)now();
  if ((State *)this->stack_frame != this) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Program ended before \"");
    StackNode::get_full_name_abi_cxx11_(&local_40,this->stack_frame);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    std::operator<<(poVar1,"\" ended\n");
    std::__cxx11::string::~string((string *)&local_40);
    abort();
  }
  StackNode::end(this->stack_frame,(Now *)&local_20);
  StackNode::adopt(&this->stack_root);
  StackNode::reduce_over_mpi(&this->stack_root,(bool)(end_time.impl.__d.__r._7_1_ & 1));
  pcVar2 = getenv("KOKKOS_PROFILE_EXPORT_JSON");
  if (pcVar2 == (char *)0x0) {
    StackNode::invert((StackNode *)local_2e0,&this->stack_root);
    StackNode::reduce_over_mpi((StackNode *)local_2e0,(bool)(end_time.impl.__d.__r._7_1_ & 1));
    std::operator<<((ostream *)&std::cout,"\nBEGIN KOKKOS PROFILING REPORT:\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"TOTAL TIME: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->stack_root).max_runtime);
    std::operator<<(poVar1," seconds\n");
    std::operator<<((ostream *)&std::cout,"TOP-DOWN TIME TREE:\n");
    std::operator<<((ostream *)&std::cout,
                    "<average time> <percent of total time> <percent time in Kokkos> <percent MPI imbalance> <remainder> <kernels per second> <number of calls> <name> [type]\n"
                   );
    std::operator<<((ostream *)&std::cout,"===================\n");
    StackNode::print(&this->stack_root,(ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"BOTTOM-UP TIME TREE:\n");
    std::operator<<((ostream *)&std::cout,
                    "<average time> <percent of total time> <percent time in Kokkos> <percent MPI imbalance> <number of calls> <name> [type]\n"
                   );
    std::operator<<((ostream *)&std::cout,"===================\n");
    StackNode::print((StackNode *)local_2e0,(ostream *)&std::cout);
    for (local_2e4 = 0; local_2e4 < 5; local_2e4 = local_2e4 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"KOKKOS ");
      pcVar2 = get_space_name(local_2e4);
      poVar1 = std::operator<<(poVar1,pcVar2);
      std::operator<<(poVar1," SPACE:\n");
      std::operator<<((ostream *)&std::cout,"===================\n");
      std::ostream::flush();
      Allocations::print(this->hwm_allocations + local_2e4,(ostream *)&std::cout,
                         (bool)(end_time.impl.__d.__r._7_1_ & 1));
    }
    print_process_hwm((bool)(end_time.impl.__d.__r._7_1_ & 1));
    std::operator<<((ostream *)&std::cout,"END KOKKOS PROFILING REPORT.\n");
    std::ostream::flush();
    StackNode::~StackNode((StackNode *)local_2e0);
    inv_stack_root.start_time.impl.__d.__r._4_4_ = 0;
  }
  else {
    std::ofstream::ofstream(local_240,"noname.json",0x10);
    StackNode::print_json(&this->stack_root,local_240);
    std::ofstream::~ofstream(local_240);
    inv_stack_root.start_time.impl.__d.__r._4_4_ = 1;
  }
  local_330 = this + 1;
  do {
    local_330 = (State *)(local_330[-1].hwm_allocations + 4);
    Allocations::~Allocations((Allocations *)local_330);
  } while (local_330 != (State *)this->hwm_allocations);
  local_348 = this->hwm_allocations;
  do {
    local_348 = local_348 + -1;
    Allocations::~Allocations(local_348);
  } while (local_348 != this->current_allocations);
  StackNode::~StackNode(&this->stack_root);
  return;
}

Assistant:

~State() {
    bool mpi_usable = false;
#if USE_MPI
    int mpi_initialized;
    MPI_Initialized(&mpi_initialized);
    if (static_cast<bool>(mpi_initialized)) mpi_usable = true;
#endif
    auto end_time = now();
    if (stack_frame != &stack_root) {
      std::cerr << "Program ended before \"" << stack_frame->get_full_name()
                << "\" ended\n";
      abort();
    }
    stack_frame->end(end_time);
    stack_root.adopt();
    stack_root.reduce_over_mpi(mpi_usable);
    if (getenv("KOKKOS_PROFILE_EXPORT_JSON")) {
#if USE_MPI
      if (mpi_usable) {
        int rank;
        MPI_Comm_rank(MPI_COMM_WORLD, &rank);
        if (rank == 0) {
          std::ofstream fout("noname.json");
          stack_root.print_json(fout);
        }
      } else
#endif
      {
        std::ofstream fout("noname.json");
        stack_root.print_json(fout);
      }
      return;
    }

    auto inv_stack_root = stack_root.invert();
    inv_stack_root.reduce_over_mpi(mpi_usable);

#if USE_MPI
    if (mpi_usable) {
      int rank;
      MPI_Comm_rank(MPI_COMM_WORLD, &rank);
      if (rank == 0) {
        std::cout << "\nBEGIN KOKKOS PROFILING REPORT:\n";
        std::cout << "TOTAL TIME: " << stack_root.max_runtime << " seconds\n";
        std::cout << "TOP-DOWN TIME TREE:\n";
        std::cout << "<average time> <percent of total time> <percent time in "
                     "Kokkos> <percent MPI imbalance> <remainder> <kernels per "
                     "second> <number of calls> <name> [type]\n";
        std::cout << "=================== \n";
        stack_root.print(std::cout);
        std::cout << "BOTTOM-UP TIME TREE:\n";
        std::cout << "<average time> <percent of total time> <percent time in "
                     "Kokkos> <percent MPI imbalance> <number of calls> <name> "
                     "[type]\n";
        std::cout << "=================== \n";
        inv_stack_root.print(std::cout);
      }
      for (int space = 0; space < NSPACES; ++space) {
        if (rank == 0) {
          std::cout << "KOKKOS " << get_space_name(space) << " SPACE:\n";
          std::cout << "=================== \n";
          std::cout.flush();
        }
        hwm_allocations[space].print(std::cout, mpi_usable);
      }
      print_process_hwm(mpi_usable);
      if (rank == 0) {
        std::cout << "END KOKKOS PROFILING REPORT.\n";
        std::cout.flush();
      }
    } else
#endif
    {
      std::cout << "\nBEGIN KOKKOS PROFILING REPORT:\n";
      std::cout << "TOTAL TIME: " << stack_root.max_runtime << " seconds\n";
      std::cout << "TOP-DOWN TIME TREE:\n";
      std::cout << "<average time> <percent of total time> <percent time in "
                   "Kokkos> <percent MPI imbalance> <remainder> <kernels per "
                   "second> <number of calls> <name> [type]\n";
      std::cout << "===================\n";
      stack_root.print(std::cout);
      std::cout << "BOTTOM-UP TIME TREE:\n";
      std::cout
          << "<average time> <percent of total time> <percent time in Kokkos> "
             "<percent MPI imbalance> <number of calls> <name> [type]\n";
      std::cout << "===================\n";
      inv_stack_root.print(std::cout);

      for (int space = 0; space < NSPACES; ++space) {
        std::cout << "KOKKOS " << get_space_name(space) << " SPACE:\n";
        std::cout << "===================\n";
        std::cout.flush();
        hwm_allocations[space].print(std::cout, mpi_usable);
      }
      print_process_hwm(mpi_usable);
      std::cout << "END KOKKOS PROFILING REPORT.\n";
      std::cout.flush();
    }
  }